

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

void Vaxpy_Serial(sunrealtype a,N_Vector x,N_Vector y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = *x->content;
  lVar2 = *(long *)((long)x->content + 0x10);
  lVar3 = *(long *)((long)y->content + 0x10);
  if ((a != 1.0) || (NAN(a))) {
    if ((a != -1.0) || (NAN(a))) {
      if (0 < lVar1) {
        lVar4 = 0;
        do {
          *(double *)(lVar3 + lVar4 * 8) =
               *(double *)(lVar2 + lVar4 * 8) * a + *(double *)(lVar3 + lVar4 * 8);
          lVar4 = lVar4 + 1;
        } while (lVar1 != lVar4);
      }
    }
    else if (0 < lVar1) {
      lVar4 = 0;
      do {
        *(double *)(lVar3 + lVar4 * 8) =
             *(double *)(lVar3 + lVar4 * 8) - *(double *)(lVar2 + lVar4 * 8);
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
    }
  }
  else if (0 < lVar1) {
    lVar4 = 0;
    do {
      *(double *)(lVar3 + lVar4 * 8) =
           *(double *)(lVar2 + lVar4 * 8) + *(double *)(lVar3 + lVar4 * 8);
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  return;
}

Assistant:

static void Vaxpy_Serial(sunrealtype a, N_Vector x, N_Vector y)
{
  sunindextype i, N;
  sunrealtype *xd, *yd;

  xd = yd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);

  if (a == ONE)
  {
    for (i = 0; i < N; i++) { yd[i] += xd[i]; }
    return;
  }

  if (a == -ONE)
  {
    for (i = 0; i < N; i++) { yd[i] -= xd[i]; }
    return;
  }

  for (i = 0; i < N; i++) { yd[i] += a * xd[i]; }

  return;
}